

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O1

int gettime(float *elapse,float *elapscpu,int *status)

{
  clock_t cVar1;
  timeval tv;
  timeval local_30;
  
  gettimeofday(&local_30,(__timezone_ptr_t)0x0);
  cVar1 = clock();
  ecpu = cVar1;
  *elapse = (float)(((int)(SUB168(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_30.tv_usec),8) >> 7) -
                    (SUB164(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_30.tv_usec),0xc) >> 0x1f)) -
                   startmilli) / 1000.0 + (float)(local_30.tv_sec - startsec);
  *elapscpu = (float)((double)(cVar1 - scpu) / 1000000.0);
  return *status;
}

Assistant:

int gettime(float *elapse, float *elapscpu, int *status)
{
#if defined(unix) || defined(__unix__)  || defined(__unix)
        struct  timeval tv;
/*        struct  timezone tz; */
	int stopmilli;
	long stopsec;

/*        gettimeofday (&tv, &tz); */
        gettimeofday (&tv, NULL);
	ecpu = clock();

        stopmilli = tv.tv_usec/1000;
	stopsec = tv.tv_sec;
	
	*elapse = (stopsec - startsec) + (stopmilli - startmilli)/1000.;
	*elapscpu = (ecpu - scpu) * 1.0 / CLOCKTICKS;
/*
printf(" (start: %ld + %d), stop: (%ld + %d) elapse: %f\n ",
startsec,startmilli,stopsec, stopmilli, *elapse);
*/
#else
/* set the elapsed time the same as the CPU time on Windows machines */
	*elapscpu = (float) ((ecpu - scpu) * 1.0 / CLOCKTICKS);
	*elapse = *elapscpu;  
#endif
	return( *status );
}